

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_backstab(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CHAR_DATA *pCVar6;
  OBJ_DATA *pOVar7;
  char *pcVar8;
  CClass *this;
  CHAR_DATA *in_RDI;
  char buf [4608];
  int dam;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  char arg [4608];
  undefined4 in_stack_ffffffffffffdb48;
  int in_stack_ffffffffffffdb4c;
  CHAR_DATA *in_stack_ffffffffffffdb50;
  undefined4 in_stack_ffffffffffffdb58;
  int in_stack_ffffffffffffdb5c;
  undefined4 in_stack_ffffffffffffdb60;
  undefined4 in_stack_ffffffffffffdb64;
  undefined8 in_stack_ffffffffffffdb68;
  skill_type *psVar9;
  int in_stack_ffffffffffffdb70;
  int in_stack_ffffffffffffdb74;
  CHAR_DATA *in_stack_ffffffffffffdb78;
  CHAR_DATA *in_stack_ffffffffffffdb80;
  char local_2438 [92];
  int in_stack_ffffffffffffdc24;
  undefined1 in_stack_ffffffffffffdc2b;
  int in_stack_ffffffffffffdc2c;
  CHAR_DATA *in_stack_ffffffffffffdc30;
  int in_stack_ffffffffffffdc4c;
  CHAR_DATA *in_stack_ffffffffffffdc50;
  int in_stack_ffffffffffffdc5c;
  undefined1 in_stack_ffffffffffffdc62;
  undefined1 in_stack_ffffffffffffdc63;
  int in_stack_ffffffffffffdc64;
  CHAR_DATA *in_stack_ffffffffffffdc68;
  CHAR_DATA *in_stack_ffffffffffffdc70;
  int in_stack_ffffffffffffdc90;
  PATHFIND_DATA *in_stack_ffffffffffffdc98;
  int in_stack_ffffffffffffed48;
  int in_stack_ffffffffffffed4c;
  CHAR_DATA *in_stack_ffffffffffffed50;
  CHAR_DATA *in_stack_ffffffffffffed58;
  char local_1218;
  
  one_argument((char *)in_stack_ffffffffffffdb50,
               (char *)CONCAT44(in_stack_ffffffffffffdb4c,in_stack_ffffffffffffdb48));
  iVar2 = get_skill(in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c);
  if (iVar2 < 2) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
  }
  else if (local_1218 == '\0') {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
  }
  else {
    pCVar6 = get_char_room(in_stack_ffffffffffffed58,(char *)in_stack_ffffffffffffed50);
    if (pCVar6 == (CHAR_DATA *)0x0) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
    }
    else if ((in_RDI->fighting == (CHAR_DATA *)0x0) && (pCVar6->fighting == (CHAR_DATA *)0x0)) {
      if (pCVar6 == in_RDI) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
      }
      else {
        pOVar7 = get_eq_char(in_RDI,0x10);
        if (pOVar7 == (OBJ_DATA *)0x0) {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
        }
        else if ((pOVar7->value[0] == 2) ||
                ((pOVar7 = get_eq_char(in_RDI,0x12), pOVar7 != (OBJ_DATA *)0x0 &&
                 (pOVar7->value[0] == 2)))) {
          bVar1 = is_safe(in_stack_ffffffffffffdb50,
                          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb4c,in_stack_ffffffffffffdb48)
                         );
          if ((!bVar1) &&
             (bVar1 = check_sidestep(in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,
                                     in_stack_ffffffffffffed4c,in_stack_ffffffffffffed48), !bVar1))
          {
            if (((double)(int)pCVar6->max_hit * 8.5) / 10.0 <= (double)pCVar6->hit) {
              WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                         in_stack_ffffffffffffdb5c);
              iVar2 = number_percent();
              iVar3 = get_skill(in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c);
              if (iVar2 < iVar3) {
                check_improve(in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc2c,
                              (bool)in_stack_ffffffffffffdc2b,in_stack_ffffffffffffdc24);
                bVar1 = is_npc((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffdb4c,in_stack_ffffffffffffdb48));
                if (((!bVar1) &&
                    (bVar1 = is_npc((CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdb4c,in_stack_ffffffffffffdb48)),
                    !bVar1)) && (pCVar6->fighting == (CHAR_DATA *)0x0)) {
                  iVar2 = number_range((int)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb4c);
                  if (iVar2 == 0) {
                    pcVar8 = pers((CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                                  in_stack_ffffffffffffdb50);
                    sprintf(local_2438,"Die, %s you backstabbing fool!",pcVar8);
                  }
                  else if (iVar2 == 1) {
                    pcVar8 = pers((CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                                  in_stack_ffffffffffffdb50);
                    sprintf(local_2438,"Help! I\'m being backstabbed by %s!",pcVar8);
                  }
                  do_myell((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                           (char *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                           in_stack_ffffffffffffdb50);
                }
                iVar2 = 0;
                one_hit_new(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68,
                            in_stack_ffffffffffffdc64,(bool)in_stack_ffffffffffffdc63,
                            (bool)in_stack_ffffffffffffdc62,in_stack_ffffffffffffdc5c,
                            in_stack_ffffffffffffdc90,(char *)in_stack_ffffffffffffdc98);
              }
              else {
                check_improve(in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc2c,
                              (bool)in_stack_ffffffffffffdc2b,in_stack_ffffffffffffdc24);
                bVar1 = is_npc((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffdb4c,in_stack_ffffffffffffdb48));
                if (((!bVar1) &&
                    (bVar1 = is_npc((CHAR_DATA *)
                                    CONCAT44(in_stack_ffffffffffffdb4c,in_stack_ffffffffffffdb48)),
                    !bVar1)) && (pCVar6->fighting == (CHAR_DATA *)0x0)) {
                  iVar2 = number_range((int)in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb4c);
                  if (iVar2 == 0) {
                    in_stack_ffffffffffffdb80 = (CHAR_DATA *)local_2438;
                    pcVar8 = pers((CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                                  in_stack_ffffffffffffdb50);
                    sprintf((char *)in_stack_ffffffffffffdb80,"Die, %s you backstabbing fool!",
                            pcVar8);
                  }
                  else if (iVar2 == 1) {
                    in_stack_ffffffffffffdb78 = (CHAR_DATA *)local_2438;
                    pcVar8 = pers((CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                                  in_stack_ffffffffffffdb50);
                    sprintf((char *)in_stack_ffffffffffffdb78,"Help! I\'m being backstabbed by %s!",
                            pcVar8);
                  }
                  do_myell((CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                           (char *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                           in_stack_ffffffffffffdb50);
                }
                iVar2 = (int)in_stack_ffffffffffffdb50;
                damage(in_stack_ffffffffffffdb80,in_stack_ffffffffffffdb78,in_stack_ffffffffffffdb74
                       ,in_stack_ffffffffffffdb70,(int)((ulong)in_stack_ffffffffffffdb68 >> 0x20),
                       SUB81((ulong)in_stack_ffffffffffffdb68 >> 0x18,0));
              }
              iVar3 = (int)in_RDI->level;
              psVar9 = skill_table + gsn_dual_backstab;
              this = char_data::Class((char_data *)
                                      CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60))
              ;
              iVar4 = CClass::GetIndex(this);
              if (psVar9->skill_level[iVar4] <= iVar3) {
                iVar4 = number_range(iVar2,in_stack_ffffffffffffdb4c);
                if (iVar4 == 0) {
                  iVar2 = get_skill(in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c);
                  if (iVar2 != 100) {
                    check_improve(in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc2c,
                                  (bool)in_stack_ffffffffffffdc2b,in_stack_ffffffffffffdc24);
                  }
                }
                else {
                  iVar4 = number_percent();
                  iVar5 = get_skill(in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c);
                  if ((iVar5 + in_RDI->level) - (int)pCVar6->level < iVar4) {
                    check_improve(in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc2c,
                                  (bool)in_stack_ffffffffffffdc2b,in_stack_ffffffffffffdc24);
                  }
                  else {
                    dice(iVar2,in_stack_ffffffffffffdb4c);
                    get_skill(in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c);
                    if (in_RDI->level < 0x23) {
                      number_range(iVar2,in_stack_ffffffffffffdb4c);
                    }
                    else if (in_RDI->level < 0x28) {
                      number_range(iVar2,in_stack_ffffffffffffdb4c);
                    }
                    else if (in_RDI->level < 0x2d) {
                      number_range(iVar2,in_stack_ffffffffffffdb4c);
                    }
                    else if (in_RDI->level < 0x32) {
                      number_range(iVar2,in_stack_ffffffffffffdb4c);
                    }
                    else {
                      number_range(iVar2,in_stack_ffffffffffffdb4c);
                    }
                    get_skill(in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc4c);
                  }
                  damage_old(in_stack_ffffffffffffdb80,in_stack_ffffffffffffdb78,iVar3,
                             in_stack_ffffffffffffdb70,(int)((ulong)psVar9 >> 0x20),
                             SUB81((ulong)psVar9 >> 0x18,0));
                }
              }
            }
            else {
              act((char *)CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                  (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58),
                  in_stack_ffffffffffffdb50,
                  (void *)CONCAT44(in_stack_ffffffffffffdb4c,in_stack_ffffffffffffdb48),0);
            }
          }
        }
        else {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
        }
      }
    }
    else {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffdb64,in_stack_ffffffffffffdb60),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb5c,in_stack_ffffffffffffdb58));
    }
  }
  return;
}

Assistant:

void do_backstab(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	int dam;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (get_skill(ch, gsn_backstab) < 2)
	{
		send_to_char("You don't know how to backstab.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		send_to_char("Backstab whom?\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr || victim->fighting)
	{
		send_to_char("You're facing the wrong end.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("How can you sneak up on yourself?\n\r", ch);
		return;
	}

	obj = get_eq_char(ch, WEAR_WIELD);

	if (!obj)
	{
		send_to_char("You must be wielding a weapon to backstab.\n\r", ch);
		return;
	}

	if (obj->value[0] != WEAPON_DAGGER)
	{
		obj = get_eq_char(ch, WEAR_DUAL_WIELD);

		if (obj == nullptr || obj->value[0] != WEAPON_DAGGER)
		{
			send_to_char("You must be wielding a dagger to backstab.\n\r", ch);
			return;
		}
	}

	if (is_safe(ch, victim))
		return;

	if (check_sidestep(ch, victim, gsn_backstab, 95))
		return;

	if (victim->hit < victim->max_hit * 8.5 / 10)
	{
		act("$N is hurt and suspicious ... you can't sneak up.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	WAIT_STATE(ch, skill_table[gsn_backstab].beats);

	if (number_percent() < get_skill(ch, gsn_backstab))
	{
		check_improve(ch, gsn_backstab, true, 1);

		if (!is_npc(ch) && !is_npc(victim) && victim->fighting == nullptr)
		{
			switch (number_range(0, 1))
			{
				case 0:
					sprintf(buf, "Die, %s you backstabbing fool!", pers(ch, victim));
					break;
				case 1:
					sprintf(buf, "Help! I'm being backstabbed by %s!", pers(ch, victim));
					break;
			}

			do_myell(victim, buf, ch);
		}

		one_hit_new(ch, victim, gsn_backstab, HIT_NOSPECIALS, HIT_UNBLOCKABLE, HIT_NOADD, URANGE(100, (ch->level - 9) * 10, 375), nullptr);
	}
	else
	{
		check_improve(ch, gsn_backstab, false, 1);

		if (!is_npc(ch) && !is_npc(victim) && victim->fighting == nullptr)
		{
			switch (number_range(0, 1))
			{
				case 0:
					sprintf(buf, "Die, %s you backstabbing fool!", pers(ch, victim));
					break;
				case 1:
					sprintf(buf, "Help! I'm being backstabbed by %s!", pers(ch, victim));
					break;
			}

			do_myell(victim, buf, ch);
		}

		damage(ch, victim, 0, gsn_backstab, DAM_NONE, true);
	}

	if (ch->level < skill_table[gsn_dual_backstab].skill_level[ch->Class()->GetIndex()])
		return;

	if (number_range(0, 3) == 0)
	{
		if (get_skill(ch, gsn_dual_backstab) != 100)
			check_improve(ch, gsn_dual_backstab, false, 1);

		return;
	}

	if (number_percent() > (get_skill(ch, gsn_dual_backstab) + ch->level - victim->level))
	{
		check_improve(ch, gsn_dual_backstab, false, 1);
		dam = 0;
	}
	else
	{
		dam = dice(obj->value[1], obj->value[2]) * get_skill(ch, gsn_dual_backstab) / 100;

		if (ch->level < 35)
			dam *= number_range(2, 4);
		else if (ch->level < 40)
			dam *= number_range(2, 5);
		else if (ch->level < 45)
			dam *= number_range(3, 5);
		else if (ch->level < 50)
			dam *= number_range(4, 6);
		else
			dam *= number_range(4, 7);

		dam += (ch->damroll * get_skill(ch, gsn_dual_backstab) / 100);
	}

	damage_old(ch, victim, dam, gsn_dual_backstab, DAM_NONE, true);
}